

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathFuncs.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::RealMath1Function<&tan>::RealMath1Function
          (RealMath1Function<&tan> *this,Compilation *comp,string *name)

{
  initializer_list<const_slang::ast::Type_*> __l;
  Type *returnType;
  allocator<const_slang::ast::Type_*> local_51;
  Type *local_50;
  iterator local_48;
  size_type local_40;
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> local_38;
  string *local_20;
  string *name_local;
  Compilation *comp_local;
  RealMath1Function<&tan> *this_local;
  
  local_20 = name;
  name_local = (string *)comp;
  comp_local = (Compilation *)this;
  local_50 = Compilation::getRealType(comp);
  local_48 = &local_50;
  local_40 = 1;
  std::allocator<const_slang::ast::Type_*>::allocator(&local_51);
  __l._M_len = local_40;
  __l._M_array = local_48;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            (&local_38,__l,&local_51);
  returnType = Compilation::getRealType((Compilation *)name_local);
  SimpleSystemSubroutine::SimpleSystemSubroutine
            (&this->super_SimpleSystemSubroutine,name,Function,1,&local_38,returnType,false,false);
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector
            (&local_38);
  std::allocator<const_slang::ast::Type_*>::~allocator(&local_51);
  (this->super_SimpleSystemSubroutine).super_SystemSubroutine._vptr_SystemSubroutine =
       (_func_int **)&PTR__RealMath1Function_00915f90;
  return;
}

Assistant:

RealMath1Function(Compilation& comp, const std::string& name) :
        SimpleSystemSubroutine(name, SubroutineKind::Function, 1, {&comp.getRealType()},
                               comp.getRealType(), false) {}